

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  TokenQueue *this_00;
  Location loc;
  size_type sVar1;
  ulong uVar2;
  Token *pTVar3;
  ulong uVar4;
  optional<wabt::Token> *poVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  TokenType TVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Token cur;
  Token local_118;
  Token local_d8;
  char *local_98;
  char *pcStack_90;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_88;
  undefined8 uStack_80;
  Token local_70;
  
  if (1 < n) {
    __assert_fail("n <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0x239,"TokenType wabt::WastParser::Peek(size_t)");
  }
  this_00 = &this->tokens_;
LAB_0018bb89:
  do {
    uVar2 = (ulong)(this->tokens_).i;
    if (((this->tokens_).tokens._M_elems[uVar2].super__Optional_base<wabt::Token,_true,_true>.
         _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true) &&
       (n < (ulong)(this->tokens_).tokens._M_elems[uVar2 ^ 1].
                   super__Optional_base<wabt::Token,_true,_true>._M_payload.
                   super__Optional_payload_base<wabt::Token>._M_engaged + 1)) {
      pTVar3 = TokenQueue::at(this_00,n);
      return pTVar3->token_type_;
    }
    WastLexer::GetToken(&local_118,this->lexer_);
    if (local_118.token_type_ != LparAnn) {
      uVar4 = (ulong)(this->tokens_).i;
      uVar2 = uVar4 ^ 1;
      if ((this->tokens_).tokens._M_elems[uVar2].super__Optional_base<wabt::Token,_true,_true>.
          _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true) {
LAB_0018be82:
        __assert_fail("!tokens[!i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0xf1b,"void wabt::WastParser::TokenQueue::push_back(Token)");
      }
      poVar5 = (this_00->tokens)._M_elems + uVar2;
      uVar7 = (undefined4)local_118.loc.filename._M_len;
      uVar8 = local_118.loc.filename._M_len._4_4_;
      uVar9 = local_118.loc.filename._M_str._0_4_;
      uVar10 = local_118.loc.filename._M_str._4_4_;
      uVar11 = local_118.loc.field_1.field_0.line;
      uVar12 = local_118.loc.field_1.field_0.first_column;
      uVar13 = local_118.loc.field_1.field_0.last_column;
      uVar14 = local_118.loc.field_1._12_4_;
      TVar15 = local_118.token_type_;
      uVar16 = local_118._36_4_;
      uVar17 = local_118.field_2.type_.enum_;
      uVar18 = local_118.field_2.type_.type_index_;
      uVar19 = local_118.field_2.literal_.text._M_len._0_4_;
      uVar20 = local_118.field_2.literal_.text._M_len._4_4_;
      uVar21 = local_118.field_2._16_4_;
      uVar22 = local_118.field_2._20_4_;
LAB_0018be0a:
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x30) = uVar19;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x34) = uVar20;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x38) = uVar21;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x3c) = uVar22;
      (poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
      super__Optional_payload_base<wabt::Token>._M_payload._M_value.token_type_ = TVar15;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x24) = uVar16;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x28) = uVar17;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x2c) = uVar18;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x10) = uVar11;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x14) = uVar12;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x18) = uVar13;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0x1c) = uVar14;
      *(undefined4 *)
       &(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
        super__Optional_payload_base<wabt::Token>._M_payload = uVar7;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 4) = uVar8;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 8) = uVar9;
      *(undefined4 *)
       ((long)&(poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
               super__Optional_payload_base<wabt::Token>._M_payload + 0xc) = uVar10;
      (poVar5->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
      super__Optional_payload_base<wabt::Token>._M_engaged = true;
      if ((this->tokens_).tokens._M_elems[uVar4].super__Optional_base<wabt::Token,_true,_true>.
          _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
        (this->tokens_).i = SUB81(uVar2,0);
      }
      goto LAB_0018bb89;
    }
    if ((this->options_->features).annotations_enabled_ == false) {
      local_88.offset = (size_t)local_118.loc.field_1.field_1.offset;
      uStack_80 = local_118.loc.field_1._8_8_;
      local_98 = (char *)local_118.loc.filename._M_len;
      pcStack_90 = local_118.loc.filename._M_str;
      Token::to_string_abi_cxx11_((string *)&local_d8,&local_118);
      Error(this,0x1f86db,(char *)local_d8.loc.filename._M_len);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_d8.loc.filename._M_len !=
          &local_d8.loc.field_1) {
        operator_delete((void *)local_d8.loc.filename._M_len,
                        (long)local_d8.loc.field_1.field_1.offset + 1);
      }
      loc.filename._M_str._0_4_ = (int)local_118.loc.filename._M_str;
      loc.filename._M_len = local_118.loc.filename._M_len;
      loc.filename._M_str._4_4_ = (int)((ulong)local_118.loc.filename._M_str >> 0x20);
      loc.field_1.field_0.line = local_118.loc.field_1._0_4_;
      loc.field_1.field_0.first_column = local_118.loc.field_1._4_4_;
      loc.field_1.field_0.last_column = (int)local_118.loc.field_1._8_8_;
      loc.field_1._12_4_ = (int)((ulong)local_118.loc.field_1._8_8_ >> 0x20);
      Token::Token(&local_70,loc,First);
      uVar4 = (ulong)(this->tokens_).i;
      uVar2 = uVar4 ^ 1;
      if ((this->tokens_).tokens._M_elems[uVar2].super__Optional_base<wabt::Token,_true,_true>.
          _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged != true) {
        poVar5 = (this_00->tokens)._M_elems + uVar2;
        uVar7 = (undefined4)local_70.loc.filename._M_len;
        uVar8 = local_70.loc.filename._M_len._4_4_;
        uVar9 = local_70.loc.filename._M_str._0_4_;
        uVar10 = local_70.loc.filename._M_str._4_4_;
        uVar11 = local_70.loc.field_1.field_0.line;
        uVar12 = local_70.loc.field_1.field_0.first_column;
        uVar13 = local_70.loc.field_1.field_0.last_column;
        uVar14 = local_70.loc.field_1._12_4_;
        TVar15 = local_70.token_type_;
        uVar16 = local_70._36_4_;
        uVar17 = local_70.field_2.type_.enum_;
        uVar18 = local_70.field_2.type_.type_index_;
        uVar19 = local_70.field_2.literal_.text._M_len._0_4_;
        uVar20 = local_70.field_2.literal_.text._M_len._4_4_;
        uVar21 = local_70.field_2._16_4_;
        uVar22 = local_70.field_2._20_4_;
        goto LAB_0018be0a;
      }
      goto LAB_0018be82;
    }
    if ((this->options_->features).code_metadata_enabled_ == true) {
      local_d8.loc.filename._M_len =
           CONCAT44(local_118.field_2.type_.type_index_,local_118.field_2.type_.enum_);
      local_d8.loc.filename._M_str =
           (char *)CONCAT44(local_118.field_2.literal_.text._M_len._4_4_,
                            local_118.field_2.literal_.text._M_len._0_4_);
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_d8,
                         "metadata.code.",0,0xe);
      if (sVar1 != 0) {
        if (5 < local_118.token_type_ - AlignEqNat) {
          __assert_fail("HasText()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                        ,99,"std::string_view wabt::Token::text() const");
        }
        goto LAB_0018bc21;
      }
LAB_0018bdd3:
      uVar4 = (ulong)(this->tokens_).i;
      uVar2 = uVar4 ^ 1;
      if ((this->tokens_).tokens._M_elems[uVar2].super__Optional_base<wabt::Token,_true,_true>.
          _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged != true) {
        poVar5 = (this_00->tokens)._M_elems + uVar2;
        uVar7 = (undefined4)local_118.loc.filename._M_len;
        uVar8 = local_118.loc.filename._M_len._4_4_;
        uVar9 = local_118.loc.filename._M_str._0_4_;
        uVar10 = local_118.loc.filename._M_str._4_4_;
        uVar11 = local_118.loc.field_1.field_0.line;
        uVar12 = local_118.loc.field_1.field_0.first_column;
        uVar13 = local_118.loc.field_1.field_0.last_column;
        uVar14 = local_118.loc.field_1._12_4_;
        TVar15 = local_118.token_type_;
        uVar16 = local_118._36_4_;
        uVar17 = local_118.field_2.type_.enum_;
        uVar18 = local_118.field_2.type_.type_index_;
        uVar19 = local_118.field_2.literal_.text._M_len._0_4_;
        uVar20 = local_118.field_2.literal_.text._M_len._4_4_;
        uVar21 = local_118.field_2._16_4_;
        uVar22 = local_118.field_2._20_4_;
        goto LAB_0018be0a;
      }
      goto LAB_0018be82;
    }
LAB_0018bc21:
    if ((CONCAT44(local_118.field_2.type_.type_index_,local_118.field_2.type_.enum_) == 6) &&
       ((short)((int *)CONCAT44(local_118.field_2.literal_.text._M_len._4_4_,
                                local_118.field_2.literal_.text._M_len._0_4_))[1] == 0x6d6f &&
        *(int *)CONCAT44(local_118.field_2.literal_.text._M_len._4_4_,
                         local_118.field_2.literal_.text._M_len._0_4_) == 0x74737563))
    goto LAB_0018bdd3;
    iVar6 = 1;
    do {
      WastLexer::GetToken(&local_d8,this->lexer_);
      local_118.loc.filename._M_len = local_d8.loc.filename._M_len;
      local_118.loc.filename._M_str = local_d8.loc.filename._M_str;
      local_118.loc.field_1.field_1.offset = local_d8.loc.field_1.field_1.offset;
      local_118.loc.field_1._8_8_ = local_d8.loc.field_1._8_8_;
      local_118.token_type_ = local_d8.token_type_;
      local_118._36_4_ = local_d8._36_4_;
      local_118.field_2.type_.enum_ = local_d8.field_2.type_.enum_;
      local_118.field_2.type_.type_index_ = local_d8.field_2.type_.type_index_;
      local_118.field_2.literal_.text._M_len._0_4_ = local_d8.field_2.literal_.text._M_len._0_4_;
      local_118.field_2.literal_.text._M_len._4_4_ = local_d8.field_2.literal_.text._M_len._4_4_;
      local_118.field_2._16_4_ = local_d8.field_2._16_4_;
      local_118.field_2._20_4_ = local_d8.field_2._20_4_;
      if ((int)local_d8.token_type_ < 0x2c) {
        if (local_d8.token_type_ == Lpar) {
LAB_0018bca3:
          iVar6 = iVar6 + 1;
        }
        else if (local_d8.token_type_ == Eof) {
          Error(this,0x1f86fe);
          break;
        }
      }
      else if (local_d8.token_type_ == Rpar) {
        iVar6 = iVar6 + -1;
      }
      else if (local_d8.token_type_ == LparAnn) goto LAB_0018bca3;
    } while (iVar6 != 0);
  } while( true );
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  assert(n <= 1);
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken();
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar, unless it is
      // a code metadata annotation or custom section. In those cases, we know
      // how to parse it.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      if ((options_->features.code_metadata_enabled() &&
           cur.text().find("metadata.code.") == 0) ||
          cur.text() == "custom") {
        tokens_.push_back(cur);
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken();
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          case TokenType::Eof:
            indent = 0;
            Error(cur.loc, "unterminated annotation");
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}